

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O3

string * __thiscall
Potassco::toString<double,unsigned_int,unsigned_int>
          (string *__return_storage_ptr__,Potassco *this,double *x,uint *y,uint *z)

{
  pointer pcVar1;
  string *psVar2;
  string res;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  psVar2 = xconvert(&local_40,*(double *)this);
  std::__cxx11::string::_M_replace_aux((ulong)psVar2,psVar2->_M_string_length,0,'\x01');
  psVar2 = xconvert(&local_40,*(uint *)x);
  std::__cxx11::string::_M_replace_aux((ulong)psVar2,psVar2->_M_string_length,0,'\x01');
  psVar2 = xconvert(&local_40,*y);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const T& x, const U& y, const V& z) {
	std::string res;
	xconvert(res, x).append(1, ',');
	xconvert(res, y).append(1, ',');
	return xconvert(res, z);
}